

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void SubtractionHelper<unsigned_int,_unsigned_char,_12>::
     SubtractThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (uint *lhs,uchar *rhs,uchar *result)

{
  byte *in_RSI;
  uint *in_RDI;
  uint tmp;
  uchar *in_stack_ffffffffffffffd8;
  
  if ((uint)*in_RSI <= *in_RDI) {
    SafeCastHelper<unsigned_char,_unsigned_int,_2>::
    CastThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              (*in_RDI - (uint)*in_RSI,in_stack_ffffffffffffffd8);
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void SubtractThrow( const T& lhs, const U& rhs, U& result ) SAFEINT_CPP_THROW
    {
        // both are unsigned - easy case
        if( rhs <= lhs )
        {
            T tmp = (T)(lhs - rhs);
            SafeCastHelper< U, T, GetCastMethod<U, T>::method >::template CastThrow<E>( tmp, result);
            return;
        }

        E::SafeIntOnOverflow();
    }